

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm_sse2.h
# Opt level: O0

void fdct8x8_new_sse2(__m128i *input,__m128i *output,int8_t cos_bit)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined8 uVar51;
  undefined8 uVar52;
  int iVar53;
  uint uVar54;
  undefined4 uVar55;
  int iVar56;
  uint uVar57;
  uint uVar58;
  uint uVar59;
  uint uVar60;
  uint uVar61;
  uint uVar62;
  int32_t *piVar63;
  char in_DL;
  undefined8 *in_RSI;
  undefined1 (*in_RDI) [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  __m128i d1_4;
  __m128i d0_4;
  __m128i c1_4;
  __m128i c0_4;
  __m128i b1_4;
  __m128i b0_4;
  __m128i a1_4;
  __m128i a0_4;
  __m128i v1_4;
  __m128i v0_4;
  __m128i u1_4;
  __m128i u0_4;
  __m128i t1_4;
  __m128i t0_4;
  __m128i d1_3;
  __m128i d0_3;
  __m128i c1_3;
  __m128i c0_3;
  __m128i b1_3;
  __m128i b0_3;
  __m128i a1_3;
  __m128i a0_3;
  __m128i v1_3;
  __m128i v0_3;
  __m128i u1_3;
  __m128i u0_3;
  __m128i t1_3;
  __m128i t0_3;
  __m128i d1_2;
  __m128i d0_2;
  __m128i c1_2;
  __m128i c0_2;
  __m128i b1_2;
  __m128i b0_2;
  __m128i a1_2;
  __m128i a0_2;
  __m128i v1_2;
  __m128i v0_2;
  __m128i u1_2;
  __m128i u0_2;
  __m128i t1_2;
  __m128i t0_2;
  __m128i d1_1;
  __m128i d0_1;
  __m128i c1_1;
  __m128i c0_1;
  __m128i b1_1;
  __m128i b0_1;
  __m128i a1_1;
  __m128i a0_1;
  __m128i v1_1;
  __m128i v0_1;
  __m128i u1_1;
  __m128i u0_1;
  __m128i t1_1;
  __m128i t0_1;
  __m128i x3 [8];
  __m128i d1;
  __m128i d0;
  __m128i c1;
  __m128i c0;
  __m128i b1;
  __m128i b0;
  __m128i a1;
  __m128i a0;
  __m128i v1;
  __m128i v0;
  __m128i u1;
  __m128i u0;
  __m128i t1;
  __m128i t0;
  __m128i x2 [8];
  __m128i x1 [8];
  __m128i cospi_m40_p24;
  __m128i cospi_p24_p40;
  __m128i cospi_m08_p56;
  __m128i cospi_p56_p08;
  __m128i cospi_m16_p48;
  __m128i cospi_p48_p16;
  __m128i cospi_p32_m32;
  __m128i cospi_p32_p32;
  __m128i cospi_m32_p32;
  __m128i __rounding;
  int32_t *cospi;
  undefined8 local_1098;
  undefined8 uStack_1090;
  undefined8 local_1088;
  undefined8 uStack_1080;
  undefined8 local_1078;
  undefined8 uStack_1070;
  undefined8 local_1068;
  undefined8 uStack_1060;
  undefined2 local_b48;
  undefined2 uStack_b46;
  undefined2 uStack_b44;
  undefined2 uStack_b42;
  undefined2 local_b38;
  undefined2 uStack_b36;
  undefined2 uStack_b34;
  undefined2 uStack_b32;
  undefined2 local_b28;
  undefined2 uStack_b26;
  undefined2 uStack_b24;
  undefined2 uStack_b22;
  undefined2 local_b18;
  undefined2 uStack_b16;
  undefined2 uStack_b14;
  undefined2 uStack_b12;
  undefined2 local_b08;
  undefined2 uStack_b06;
  undefined2 uStack_b04;
  undefined2 uStack_b02;
  undefined2 local_af8;
  undefined2 uStack_af6;
  undefined2 uStack_af4;
  undefined2 uStack_af2;
  undefined2 local_ae8;
  undefined2 uStack_ae6;
  undefined2 uStack_ae4;
  undefined2 uStack_ae2;
  undefined2 local_ad8;
  undefined2 uStack_ad6;
  undefined2 uStack_ad4;
  undefined2 uStack_ad2;
  undefined2 local_ac8;
  undefined2 uStack_ac6;
  undefined2 uStack_ac4;
  undefined2 uStack_ac2;
  undefined2 local_ab8;
  undefined2 uStack_ab6;
  undefined2 uStack_ab4;
  undefined2 uStack_ab2;
  undefined2 uStack_aa0;
  undefined2 uStack_a9e;
  undefined2 uStack_a9c;
  undefined2 uStack_a9a;
  undefined2 uStack_a90;
  undefined2 uStack_a8e;
  undefined2 uStack_a8c;
  undefined2 uStack_a8a;
  undefined2 uStack_a80;
  undefined2 uStack_a7e;
  undefined2 uStack_a7c;
  undefined2 uStack_a7a;
  undefined2 uStack_a70;
  undefined2 uStack_a6e;
  undefined2 uStack_a6c;
  undefined2 uStack_a6a;
  undefined2 uStack_a60;
  undefined2 uStack_a5e;
  undefined2 uStack_a5c;
  undefined2 uStack_a5a;
  undefined2 uStack_a50;
  undefined2 uStack_a4e;
  undefined2 uStack_a4c;
  undefined2 uStack_a4a;
  undefined2 uStack_a40;
  undefined2 uStack_a3e;
  undefined2 uStack_a3c;
  undefined2 uStack_a3a;
  undefined2 uStack_a30;
  undefined2 uStack_a2e;
  undefined2 uStack_a2c;
  undefined2 uStack_a2a;
  undefined2 uStack_a20;
  undefined2 uStack_a1e;
  undefined2 uStack_a1c;
  undefined2 uStack_a1a;
  undefined2 uStack_a10;
  undefined2 uStack_a0e;
  undefined2 uStack_a0c;
  undefined2 uStack_a0a;
  int local_778;
  int iStack_774;
  int iStack_770;
  int iStack_76c;
  int local_758;
  int iStack_754;
  int iStack_750;
  int iStack_74c;
  int local_738;
  int iStack_734;
  int iStack_730;
  int iStack_72c;
  int local_718;
  int iStack_714;
  int iStack_710;
  int iStack_70c;
  int local_6f8;
  int iStack_6f4;
  int iStack_6f0;
  int iStack_6ec;
  int local_6d8;
  int iStack_6d4;
  int iStack_6d0;
  int iStack_6cc;
  int local_6b8;
  int iStack_6b4;
  int iStack_6b0;
  int iStack_6ac;
  int local_698;
  int iStack_694;
  int iStack_690;
  int iStack_68c;
  int local_678;
  int iStack_674;
  int iStack_670;
  int iStack_66c;
  int local_658;
  int iStack_654;
  int iStack_650;
  int iStack_64c;
  int local_638;
  int iStack_634;
  int iStack_630;
  int iStack_62c;
  int local_618;
  int iStack_614;
  int iStack_610;
  int iStack_60c;
  int local_5f8;
  int iStack_5f4;
  int iStack_5f0;
  int iStack_5ec;
  int local_5d8;
  int iStack_5d4;
  int iStack_5d0;
  int iStack_5cc;
  int local_5b8;
  int iStack_5b4;
  int iStack_5b0;
  int iStack_5ac;
  int local_598;
  int iStack_594;
  int iStack_590;
  int iStack_58c;
  int local_578;
  int iStack_574;
  int iStack_570;
  int iStack_56c;
  int local_558;
  int iStack_554;
  int iStack_550;
  int iStack_54c;
  int local_538;
  int iStack_534;
  int iStack_530;
  int iStack_52c;
  int local_518;
  int iStack_514;
  int iStack_510;
  int iStack_50c;
  
  piVar63 = cospi_arr((int)in_DL);
  iVar53 = 1 << (in_DL - 1U & 0x1f);
  uVar54 = -piVar63[0x20] & 0xffffU | piVar63[0x20] << 0x10;
  uVar55 = CONCAT22((short)piVar63[0x20],(short)piVar63[0x20]);
  uVar51 = CONCAT44(uVar55,uVar55);
  uVar52 = CONCAT44(uVar55,uVar55);
  iVar56 = (piVar63[0x20] & 0xffffU) + piVar63[0x20] * -0x10000;
  uVar57 = (uint)*(ushort *)(piVar63 + 0x30) | piVar63[0x10] << 0x10;
  uVar58 = -piVar63[0x10] & 0xffffU | piVar63[0x30] << 0x10;
  uVar59 = (uint)*(ushort *)(piVar63 + 0x38) | piVar63[8] << 0x10;
  uVar60 = -piVar63[8] & 0xffffU | piVar63[0x38] << 0x10;
  uVar61 = (uint)*(ushort *)(piVar63 + 0x18) | piVar63[0x28] << 0x10;
  uVar62 = -piVar63[0x28] & 0xffffU | piVar63[0x18] << 0x10;
  auVar64 = paddsw(*in_RDI,in_RDI[7]);
  auVar65 = psubsw(*in_RDI,in_RDI[7]);
  auVar66 = paddsw(in_RDI[1],in_RDI[6]);
  auVar67 = psubsw(in_RDI[1],in_RDI[6]);
  auVar68 = paddsw(in_RDI[2],in_RDI[5]);
  auVar69 = psubsw(in_RDI[2],in_RDI[5]);
  auVar70 = paddsw(in_RDI[3],in_RDI[4]);
  auVar71 = psubsw(in_RDI[3],in_RDI[4]);
  auVar72 = paddsw(auVar64,auVar70);
  auVar64 = psubsw(auVar64,auVar70);
  auVar70 = paddsw(auVar66,auVar68);
  auVar66 = psubsw(auVar66,auVar68);
  local_ab8 = auVar69._0_2_;
  uStack_ab6 = auVar69._2_2_;
  uStack_ab4 = auVar69._4_2_;
  uStack_ab2 = auVar69._6_2_;
  local_ac8 = auVar67._0_2_;
  uStack_ac6 = auVar67._2_2_;
  uStack_ac4 = auVar67._4_2_;
  uStack_ac2 = auVar67._6_2_;
  uStack_a10 = auVar69._8_2_;
  uStack_a0e = auVar69._10_2_;
  uStack_a0c = auVar69._12_2_;
  uStack_a0a = auVar69._14_2_;
  uStack_a20 = auVar67._8_2_;
  uStack_a1e = auVar67._10_2_;
  uStack_a1c = auVar67._12_2_;
  uStack_a1a = auVar67._14_2_;
  auVar30._2_2_ = local_ac8;
  auVar30._0_2_ = local_ab8;
  auVar30._4_2_ = uStack_ab6;
  auVar30._6_2_ = uStack_ac6;
  auVar30._10_2_ = uStack_ac4;
  auVar30._8_2_ = uStack_ab4;
  auVar30._12_2_ = uStack_ab2;
  auVar30._14_2_ = uStack_ac2;
  auVar29._8_8_ = CONCAT44(uVar54,uVar54);
  auVar29._0_8_ = CONCAT44(uVar54,uVar54);
  auVar67 = pmaddwd(auVar30,auVar29);
  auVar28._2_2_ = uStack_a20;
  auVar28._0_2_ = uStack_a10;
  auVar28._4_2_ = uStack_a0e;
  auVar28._6_2_ = uStack_a1e;
  auVar28._10_2_ = uStack_a1c;
  auVar28._8_2_ = uStack_a0c;
  auVar28._12_2_ = uStack_a0a;
  auVar28._14_2_ = uStack_a1a;
  auVar27._8_8_ = CONCAT44(uVar54,uVar54);
  auVar27._0_8_ = CONCAT44(uVar54,uVar54);
  auVar68 = pmaddwd(auVar28,auVar27);
  auVar26._2_2_ = local_ac8;
  auVar26._0_2_ = local_ab8;
  auVar26._4_2_ = uStack_ab6;
  auVar26._6_2_ = uStack_ac6;
  auVar26._10_2_ = uStack_ac4;
  auVar26._8_2_ = uStack_ab4;
  auVar26._12_2_ = uStack_ab2;
  auVar26._14_2_ = uStack_ac2;
  auVar25._8_8_ = uVar52;
  auVar25._0_8_ = uVar51;
  auVar69 = pmaddwd(auVar26,auVar25);
  auVar24._2_2_ = uStack_a20;
  auVar24._0_2_ = uStack_a10;
  auVar24._4_2_ = uStack_a0e;
  auVar24._6_2_ = uStack_a1e;
  auVar24._10_2_ = uStack_a1c;
  auVar24._8_2_ = uStack_a0c;
  auVar24._12_2_ = uStack_a0a;
  auVar24._14_2_ = uStack_a1a;
  auVar23._8_8_ = uVar52;
  auVar23._0_8_ = uVar51;
  auVar73 = pmaddwd(auVar24,auVar23);
  local_518 = auVar67._0_4_;
  iStack_514 = auVar67._4_4_;
  iStack_510 = auVar67._8_4_;
  iStack_50c = auVar67._12_4_;
  local_538 = auVar68._0_4_;
  iStack_534 = auVar68._4_4_;
  iStack_530 = auVar68._8_4_;
  iStack_52c = auVar68._12_4_;
  local_558 = auVar69._0_4_;
  iStack_554 = auVar69._4_4_;
  iStack_550 = auVar69._8_4_;
  iStack_54c = auVar69._12_4_;
  local_578 = auVar73._0_4_;
  iStack_574 = auVar73._4_4_;
  iStack_570 = auVar73._8_4_;
  iStack_56c = auVar73._12_4_;
  auVar67 = ZEXT416((uint)(int)in_DL);
  auVar68 = ZEXT416((uint)(int)in_DL);
  auVar69 = ZEXT416((uint)(int)in_DL);
  auVar73 = ZEXT416((uint)(int)in_DL);
  auVar50._4_4_ = iStack_514 + iVar53 >> auVar67;
  auVar50._0_4_ = local_518 + iVar53 >> auVar67;
  auVar50._12_4_ = iStack_50c + iVar53 >> auVar67;
  auVar50._8_4_ = iStack_510 + iVar53 >> auVar67;
  auVar49._4_4_ = iStack_534 + iVar53 >> auVar68;
  auVar49._0_4_ = local_538 + iVar53 >> auVar68;
  auVar49._12_4_ = iStack_52c + iVar53 >> auVar68;
  auVar49._8_4_ = iStack_530 + iVar53 >> auVar68;
  auVar67 = packssdw(auVar50,auVar49);
  auVar48._4_4_ = iStack_554 + iVar53 >> auVar69;
  auVar48._0_4_ = local_558 + iVar53 >> auVar69;
  auVar48._12_4_ = iStack_54c + iVar53 >> auVar69;
  auVar48._8_4_ = iStack_550 + iVar53 >> auVar69;
  auVar47._4_4_ = iStack_574 + iVar53 >> auVar73;
  auVar47._0_4_ = local_578 + iVar53 >> auVar73;
  auVar47._12_4_ = iStack_56c + iVar53 >> auVar73;
  auVar47._8_4_ = iStack_570 + iVar53 >> auVar73;
  auVar68 = packssdw(auVar48,auVar47);
  local_ad8 = auVar72._0_2_;
  uStack_ad6 = auVar72._2_2_;
  uStack_ad4 = auVar72._4_2_;
  uStack_ad2 = auVar72._6_2_;
  local_ae8 = auVar70._0_2_;
  uStack_ae6 = auVar70._2_2_;
  uStack_ae4 = auVar70._4_2_;
  uStack_ae2 = auVar70._6_2_;
  uStack_a30 = auVar72._8_2_;
  uStack_a2e = auVar72._10_2_;
  uStack_a2c = auVar72._12_2_;
  uStack_a2a = auVar72._14_2_;
  uStack_a40 = auVar70._8_2_;
  uStack_a3e = auVar70._10_2_;
  uStack_a3c = auVar70._12_2_;
  uStack_a3a = auVar70._14_2_;
  auVar22._2_2_ = local_ae8;
  auVar22._0_2_ = local_ad8;
  auVar22._4_2_ = uStack_ad6;
  auVar22._6_2_ = uStack_ae6;
  auVar22._10_2_ = uStack_ae4;
  auVar22._8_2_ = uStack_ad4;
  auVar22._12_2_ = uStack_ad2;
  auVar22._14_2_ = uStack_ae2;
  auVar21._8_8_ = uVar52;
  auVar21._0_8_ = uVar51;
  auVar69 = pmaddwd(auVar22,auVar21);
  auVar20._2_2_ = uStack_a40;
  auVar20._0_2_ = uStack_a30;
  auVar20._4_2_ = uStack_a2e;
  auVar20._6_2_ = uStack_a3e;
  auVar20._10_2_ = uStack_a3c;
  auVar20._8_2_ = uStack_a2c;
  auVar20._12_2_ = uStack_a2a;
  auVar20._14_2_ = uStack_a3a;
  auVar19._8_8_ = uVar52;
  auVar19._0_8_ = uVar51;
  auVar70 = pmaddwd(auVar20,auVar19);
  auVar18._2_2_ = local_ae8;
  auVar18._0_2_ = local_ad8;
  auVar18._4_2_ = uStack_ad6;
  auVar18._6_2_ = uStack_ae6;
  auVar18._10_2_ = uStack_ae4;
  auVar18._8_2_ = uStack_ad4;
  auVar18._12_2_ = uStack_ad2;
  auVar18._14_2_ = uStack_ae2;
  auVar17._8_8_ = CONCAT44(iVar56,iVar56);
  auVar17._0_8_ = CONCAT44(iVar56,iVar56);
  auVar72 = pmaddwd(auVar18,auVar17);
  auVar16._2_2_ = uStack_a40;
  auVar16._0_2_ = uStack_a30;
  auVar16._4_2_ = uStack_a2e;
  auVar16._6_2_ = uStack_a3e;
  auVar16._10_2_ = uStack_a3c;
  auVar16._8_2_ = uStack_a2c;
  auVar16._12_2_ = uStack_a2a;
  auVar16._14_2_ = uStack_a3a;
  auVar15._8_8_ = CONCAT44(iVar56,iVar56);
  auVar15._0_8_ = CONCAT44(iVar56,iVar56);
  auVar73 = pmaddwd(auVar16,auVar15);
  local_598 = auVar69._0_4_;
  iStack_594 = auVar69._4_4_;
  iStack_590 = auVar69._8_4_;
  iStack_58c = auVar69._12_4_;
  local_5b8 = auVar70._0_4_;
  iStack_5b4 = auVar70._4_4_;
  iStack_5b0 = auVar70._8_4_;
  iStack_5ac = auVar70._12_4_;
  local_5d8 = auVar72._0_4_;
  iStack_5d4 = auVar72._4_4_;
  iStack_5d0 = auVar72._8_4_;
  iStack_5cc = auVar72._12_4_;
  local_5f8 = auVar73._0_4_;
  iStack_5f4 = auVar73._4_4_;
  iStack_5f0 = auVar73._8_4_;
  iStack_5ec = auVar73._12_4_;
  auVar69 = ZEXT416((uint)(int)in_DL);
  auVar70 = ZEXT416((uint)(int)in_DL);
  auVar72 = ZEXT416((uint)(int)in_DL);
  auVar73 = ZEXT416((uint)(int)in_DL);
  auVar46._4_4_ = iStack_594 + iVar53 >> auVar69;
  auVar46._0_4_ = local_598 + iVar53 >> auVar69;
  auVar46._12_4_ = iStack_58c + iVar53 >> auVar69;
  auVar46._8_4_ = iStack_590 + iVar53 >> auVar69;
  auVar45._4_4_ = iStack_5b4 + iVar53 >> auVar70;
  auVar45._0_4_ = local_5b8 + iVar53 >> auVar70;
  auVar45._12_4_ = iStack_5ac + iVar53 >> auVar70;
  auVar45._8_4_ = iStack_5b0 + iVar53 >> auVar70;
  auVar69 = packssdw(auVar46,auVar45);
  auVar44._4_4_ = iStack_5d4 + iVar53 >> auVar72;
  auVar44._0_4_ = local_5d8 + iVar53 >> auVar72;
  auVar44._12_4_ = iStack_5cc + iVar53 >> auVar72;
  auVar44._8_4_ = iStack_5d0 + iVar53 >> auVar72;
  auVar43._4_4_ = iStack_5f4 + iVar53 >> auVar73;
  auVar43._0_4_ = local_5f8 + iVar53 >> auVar73;
  auVar43._12_4_ = iStack_5ec + iVar53 >> auVar73;
  auVar43._8_4_ = iStack_5f0 + iVar53 >> auVar73;
  auVar70 = packssdw(auVar44,auVar43);
  local_af8 = auVar66._0_2_;
  uStack_af6 = auVar66._2_2_;
  uStack_af4 = auVar66._4_2_;
  uStack_af2 = auVar66._6_2_;
  local_b08 = auVar64._0_2_;
  uStack_b06 = auVar64._2_2_;
  uStack_b04 = auVar64._4_2_;
  uStack_b02 = auVar64._6_2_;
  uStack_a50 = auVar66._8_2_;
  uStack_a4e = auVar66._10_2_;
  uStack_a4c = auVar66._12_2_;
  uStack_a4a = auVar66._14_2_;
  uStack_a60 = auVar64._8_2_;
  uStack_a5e = auVar64._10_2_;
  uStack_a5c = auVar64._12_2_;
  uStack_a5a = auVar64._14_2_;
  auVar14._2_2_ = local_b08;
  auVar14._0_2_ = local_af8;
  auVar14._4_2_ = uStack_af6;
  auVar14._6_2_ = uStack_b06;
  auVar14._10_2_ = uStack_b04;
  auVar14._8_2_ = uStack_af4;
  auVar14._12_2_ = uStack_af2;
  auVar14._14_2_ = uStack_b02;
  auVar13._8_8_ = CONCAT44(uVar57,uVar57);
  auVar13._0_8_ = CONCAT44(uVar57,uVar57);
  auVar64 = pmaddwd(auVar14,auVar13);
  auVar12._2_2_ = uStack_a60;
  auVar12._0_2_ = uStack_a50;
  auVar12._4_2_ = uStack_a4e;
  auVar12._6_2_ = uStack_a5e;
  auVar12._10_2_ = uStack_a5c;
  auVar12._8_2_ = uStack_a4c;
  auVar12._12_2_ = uStack_a4a;
  auVar12._14_2_ = uStack_a5a;
  auVar11._8_8_ = CONCAT44(uVar57,uVar57);
  auVar11._0_8_ = CONCAT44(uVar57,uVar57);
  auVar66 = pmaddwd(auVar12,auVar11);
  auVar10._2_2_ = local_b08;
  auVar10._0_2_ = local_af8;
  auVar10._4_2_ = uStack_af6;
  auVar10._6_2_ = uStack_b06;
  auVar10._10_2_ = uStack_b04;
  auVar10._8_2_ = uStack_af4;
  auVar10._12_2_ = uStack_af2;
  auVar10._14_2_ = uStack_b02;
  auVar9._8_8_ = CONCAT44(uVar58,uVar58);
  auVar9._0_8_ = CONCAT44(uVar58,uVar58);
  auVar72 = pmaddwd(auVar10,auVar9);
  auVar8._2_2_ = uStack_a60;
  auVar8._0_2_ = uStack_a50;
  auVar8._4_2_ = uStack_a4e;
  auVar8._6_2_ = uStack_a5e;
  auVar8._10_2_ = uStack_a5c;
  auVar8._8_2_ = uStack_a4c;
  auVar8._12_2_ = uStack_a4a;
  auVar8._14_2_ = uStack_a5a;
  auVar7._8_8_ = CONCAT44(uVar58,uVar58);
  auVar7._0_8_ = CONCAT44(uVar58,uVar58);
  auVar73 = pmaddwd(auVar8,auVar7);
  local_618 = auVar64._0_4_;
  iStack_614 = auVar64._4_4_;
  iStack_610 = auVar64._8_4_;
  iStack_60c = auVar64._12_4_;
  local_638 = auVar66._0_4_;
  iStack_634 = auVar66._4_4_;
  iStack_630 = auVar66._8_4_;
  iStack_62c = auVar66._12_4_;
  local_658 = auVar72._0_4_;
  iStack_654 = auVar72._4_4_;
  iStack_650 = auVar72._8_4_;
  iStack_64c = auVar72._12_4_;
  local_678 = auVar73._0_4_;
  iStack_674 = auVar73._4_4_;
  iStack_670 = auVar73._8_4_;
  iStack_66c = auVar73._12_4_;
  auVar64 = ZEXT416((uint)(int)in_DL);
  auVar66 = ZEXT416((uint)(int)in_DL);
  auVar72 = ZEXT416((uint)(int)in_DL);
  auVar73 = ZEXT416((uint)(int)in_DL);
  auVar42._4_4_ = iStack_614 + iVar53 >> auVar64;
  auVar42._0_4_ = local_618 + iVar53 >> auVar64;
  auVar42._12_4_ = iStack_60c + iVar53 >> auVar64;
  auVar42._8_4_ = iStack_610 + iVar53 >> auVar64;
  auVar41._4_4_ = iStack_634 + iVar53 >> auVar66;
  auVar41._0_4_ = local_638 + iVar53 >> auVar66;
  auVar41._12_4_ = iStack_62c + iVar53 >> auVar66;
  auVar41._8_4_ = iStack_630 + iVar53 >> auVar66;
  auVar64 = packssdw(auVar42,auVar41);
  auVar40._4_4_ = iStack_654 + iVar53 >> auVar72;
  auVar40._0_4_ = local_658 + iVar53 >> auVar72;
  auVar40._12_4_ = iStack_64c + iVar53 >> auVar72;
  auVar40._8_4_ = iStack_650 + iVar53 >> auVar72;
  auVar39._4_4_ = iStack_674 + iVar53 >> auVar73;
  auVar39._0_4_ = local_678 + iVar53 >> auVar73;
  auVar39._12_4_ = iStack_66c + iVar53 >> auVar73;
  auVar39._8_4_ = iStack_670 + iVar53 >> auVar73;
  auVar66 = packssdw(auVar40,auVar39);
  auVar72 = paddsw(auVar71,auVar67);
  auVar67 = psubsw(auVar71,auVar67);
  auVar71 = psubsw(auVar65,auVar68);
  auVar65 = paddsw(auVar65,auVar68);
  local_1098 = auVar69._0_8_;
  uStack_1090 = auVar69._8_8_;
  *in_RSI = local_1098;
  in_RSI[1] = uStack_1090;
  local_1088 = auVar70._0_8_;
  uStack_1080 = auVar70._8_8_;
  in_RSI[8] = local_1088;
  in_RSI[9] = uStack_1080;
  local_1078 = auVar64._0_8_;
  uStack_1070 = auVar64._8_8_;
  in_RSI[4] = local_1078;
  in_RSI[5] = uStack_1070;
  local_1068 = auVar66._0_8_;
  uStack_1060 = auVar66._8_8_;
  in_RSI[0xc] = local_1068;
  in_RSI[0xd] = uStack_1060;
  local_b18 = auVar72._0_2_;
  uStack_b16 = auVar72._2_2_;
  uStack_b14 = auVar72._4_2_;
  uStack_b12 = auVar72._6_2_;
  local_b28 = auVar65._0_2_;
  uStack_b26 = auVar65._2_2_;
  uStack_b24 = auVar65._4_2_;
  uStack_b22 = auVar65._6_2_;
  uStack_a70 = auVar72._8_2_;
  uStack_a6e = auVar72._10_2_;
  uStack_a6c = auVar72._12_2_;
  uStack_a6a = auVar72._14_2_;
  uStack_a80 = auVar65._8_2_;
  uStack_a7e = auVar65._10_2_;
  uStack_a7c = auVar65._12_2_;
  uStack_a7a = auVar65._14_2_;
  auVar6._2_2_ = local_b28;
  auVar6._0_2_ = local_b18;
  auVar6._4_2_ = uStack_b16;
  auVar6._6_2_ = uStack_b26;
  auVar6._10_2_ = uStack_b24;
  auVar6._8_2_ = uStack_b14;
  auVar6._12_2_ = uStack_b12;
  auVar6._14_2_ = uStack_b22;
  auVar5._8_8_ = CONCAT44(uVar59,uVar59);
  auVar5._0_8_ = CONCAT44(uVar59,uVar59);
  auVar64 = pmaddwd(auVar6,auVar5);
  auVar4._2_2_ = uStack_a80;
  auVar4._0_2_ = uStack_a70;
  auVar4._4_2_ = uStack_a6e;
  auVar4._6_2_ = uStack_a7e;
  auVar4._10_2_ = uStack_a7c;
  auVar4._8_2_ = uStack_a6c;
  auVar4._12_2_ = uStack_a6a;
  auVar4._14_2_ = uStack_a7a;
  auVar3._8_8_ = CONCAT44(uVar59,uVar59);
  auVar3._0_8_ = CONCAT44(uVar59,uVar59);
  auVar65 = pmaddwd(auVar4,auVar3);
  auVar2._2_2_ = local_b28;
  auVar2._0_2_ = local_b18;
  auVar2._4_2_ = uStack_b16;
  auVar2._6_2_ = uStack_b26;
  auVar2._10_2_ = uStack_b24;
  auVar2._8_2_ = uStack_b14;
  auVar2._12_2_ = uStack_b12;
  auVar2._14_2_ = uStack_b22;
  auVar1._8_8_ = CONCAT44(uVar60,uVar60);
  auVar1._0_8_ = CONCAT44(uVar60,uVar60);
  auVar66 = pmaddwd(auVar2,auVar1);
  auVar73._2_2_ = uStack_a80;
  auVar73._0_2_ = uStack_a70;
  auVar73._4_2_ = uStack_a6e;
  auVar73._6_2_ = uStack_a7e;
  auVar73._10_2_ = uStack_a7c;
  auVar73._8_2_ = uStack_a6c;
  auVar73._12_2_ = uStack_a6a;
  auVar73._14_2_ = uStack_a7a;
  auVar72._8_8_ = CONCAT44(uVar60,uVar60);
  auVar72._0_8_ = CONCAT44(uVar60,uVar60);
  auVar68 = pmaddwd(auVar73,auVar72);
  local_698 = auVar64._0_4_;
  iStack_694 = auVar64._4_4_;
  iStack_690 = auVar64._8_4_;
  iStack_68c = auVar64._12_4_;
  local_6b8 = auVar65._0_4_;
  iStack_6b4 = auVar65._4_4_;
  iStack_6b0 = auVar65._8_4_;
  iStack_6ac = auVar65._12_4_;
  local_6d8 = auVar66._0_4_;
  iStack_6d4 = auVar66._4_4_;
  iStack_6d0 = auVar66._8_4_;
  iStack_6cc = auVar66._12_4_;
  local_6f8 = auVar68._0_4_;
  iStack_6f4 = auVar68._4_4_;
  iStack_6f0 = auVar68._8_4_;
  iStack_6ec = auVar68._12_4_;
  auVar64 = ZEXT416((uint)(int)in_DL);
  auVar65 = ZEXT416((uint)(int)in_DL);
  auVar66 = ZEXT416((uint)(int)in_DL);
  auVar68 = ZEXT416((uint)(int)in_DL);
  auVar38._4_4_ = iStack_694 + iVar53 >> auVar64;
  auVar38._0_4_ = local_698 + iVar53 >> auVar64;
  auVar38._12_4_ = iStack_68c + iVar53 >> auVar64;
  auVar38._8_4_ = iStack_690 + iVar53 >> auVar64;
  auVar37._4_4_ = iStack_6b4 + iVar53 >> auVar65;
  auVar37._0_4_ = local_6b8 + iVar53 >> auVar65;
  auVar37._12_4_ = iStack_6ac + iVar53 >> auVar65;
  auVar37._8_4_ = iStack_6b0 + iVar53 >> auVar65;
  auVar64 = packssdw(auVar38,auVar37);
  *(undefined1 (*) [16])(in_RSI + 2) = auVar64;
  auVar36._4_4_ = iStack_6d4 + iVar53 >> auVar66;
  auVar36._0_4_ = local_6d8 + iVar53 >> auVar66;
  auVar36._12_4_ = iStack_6cc + iVar53 >> auVar66;
  auVar36._8_4_ = iStack_6d0 + iVar53 >> auVar66;
  auVar35._4_4_ = iStack_6f4 + iVar53 >> auVar68;
  auVar35._0_4_ = local_6f8 + iVar53 >> auVar68;
  auVar35._12_4_ = iStack_6ec + iVar53 >> auVar68;
  auVar35._8_4_ = iStack_6f0 + iVar53 >> auVar68;
  auVar64 = packssdw(auVar36,auVar35);
  *(undefined1 (*) [16])(in_RSI + 0xe) = auVar64;
  local_b38 = auVar67._0_2_;
  uStack_b36 = auVar67._2_2_;
  uStack_b34 = auVar67._4_2_;
  uStack_b32 = auVar67._6_2_;
  local_b48 = auVar71._0_2_;
  uStack_b46 = auVar71._2_2_;
  uStack_b44 = auVar71._4_2_;
  uStack_b42 = auVar71._6_2_;
  uStack_a90 = auVar67._8_2_;
  uStack_a8e = auVar67._10_2_;
  uStack_a8c = auVar67._12_2_;
  uStack_a8a = auVar67._14_2_;
  uStack_aa0 = auVar71._8_2_;
  uStack_a9e = auVar71._10_2_;
  uStack_a9c = auVar71._12_2_;
  uStack_a9a = auVar71._14_2_;
  auVar71._2_2_ = local_b48;
  auVar71._0_2_ = local_b38;
  auVar71._4_2_ = uStack_b36;
  auVar71._6_2_ = uStack_b46;
  auVar71._10_2_ = uStack_b44;
  auVar71._8_2_ = uStack_b34;
  auVar71._12_2_ = uStack_b32;
  auVar71._14_2_ = uStack_b42;
  auVar70._8_8_ = CONCAT44(uVar61,uVar61);
  auVar70._0_8_ = CONCAT44(uVar61,uVar61);
  auVar70 = pmaddwd(auVar71,auVar70);
  auVar69._2_2_ = uStack_aa0;
  auVar69._0_2_ = uStack_a90;
  auVar69._4_2_ = uStack_a8e;
  auVar69._6_2_ = uStack_a9e;
  auVar69._10_2_ = uStack_a9c;
  auVar69._8_2_ = uStack_a8c;
  auVar69._12_2_ = uStack_a8a;
  auVar69._14_2_ = uStack_a9a;
  auVar68._8_8_ = CONCAT44(uVar61,uVar61);
  auVar68._0_8_ = CONCAT44(uVar61,uVar61);
  auVar68 = pmaddwd(auVar69,auVar68);
  auVar67._2_2_ = local_b48;
  auVar67._0_2_ = local_b38;
  auVar67._4_2_ = uStack_b36;
  auVar67._6_2_ = uStack_b46;
  auVar67._10_2_ = uStack_b44;
  auVar67._8_2_ = uStack_b34;
  auVar67._12_2_ = uStack_b32;
  auVar67._14_2_ = uStack_b42;
  auVar66._8_8_ = CONCAT44(uVar62,uVar62);
  auVar66._0_8_ = CONCAT44(uVar62,uVar62);
  auVar66 = pmaddwd(auVar67,auVar66);
  auVar65._2_2_ = uStack_aa0;
  auVar65._0_2_ = uStack_a90;
  auVar65._4_2_ = uStack_a8e;
  auVar65._6_2_ = uStack_a9e;
  auVar65._10_2_ = uStack_a9c;
  auVar65._8_2_ = uStack_a8c;
  auVar65._12_2_ = uStack_a8a;
  auVar65._14_2_ = uStack_a9a;
  auVar64._8_8_ = CONCAT44(uVar62,uVar62);
  auVar64._0_8_ = CONCAT44(uVar62,uVar62);
  auVar64 = pmaddwd(auVar65,auVar64);
  local_718 = auVar70._0_4_;
  iStack_714 = auVar70._4_4_;
  iStack_710 = auVar70._8_4_;
  iStack_70c = auVar70._12_4_;
  local_738 = auVar68._0_4_;
  iStack_734 = auVar68._4_4_;
  iStack_730 = auVar68._8_4_;
  iStack_72c = auVar68._12_4_;
  local_758 = auVar66._0_4_;
  iStack_754 = auVar66._4_4_;
  iStack_750 = auVar66._8_4_;
  iStack_74c = auVar66._12_4_;
  local_778 = auVar64._0_4_;
  iStack_774 = auVar64._4_4_;
  iStack_770 = auVar64._8_4_;
  iStack_76c = auVar64._12_4_;
  auVar64 = ZEXT416((uint)(int)in_DL);
  auVar65 = ZEXT416((uint)(int)in_DL);
  auVar66 = ZEXT416((uint)(int)in_DL);
  auVar67 = ZEXT416((uint)(int)in_DL);
  auVar34._4_4_ = iStack_714 + iVar53 >> auVar64;
  auVar34._0_4_ = local_718 + iVar53 >> auVar64;
  auVar34._12_4_ = iStack_70c + iVar53 >> auVar64;
  auVar34._8_4_ = iStack_710 + iVar53 >> auVar64;
  auVar33._4_4_ = iStack_734 + iVar53 >> auVar65;
  auVar33._0_4_ = local_738 + iVar53 >> auVar65;
  auVar33._12_4_ = iStack_72c + iVar53 >> auVar65;
  auVar33._8_4_ = iStack_730 + iVar53 >> auVar65;
  auVar64 = packssdw(auVar34,auVar33);
  *(undefined1 (*) [16])(in_RSI + 10) = auVar64;
  auVar32._4_4_ = iStack_754 + iVar53 >> auVar66;
  auVar32._0_4_ = local_758 + iVar53 >> auVar66;
  auVar32._12_4_ = iStack_74c + iVar53 >> auVar66;
  auVar32._8_4_ = iStack_750 + iVar53 >> auVar66;
  auVar31._4_4_ = iStack_774 + iVar53 >> auVar67;
  auVar31._0_4_ = local_778 + iVar53 >> auVar67;
  auVar31._12_4_ = iStack_76c + iVar53 >> auVar67;
  auVar31._8_4_ = iStack_770 + iVar53 >> auVar67;
  auVar64 = packssdw(auVar32,auVar31);
  *(undefined1 (*) [16])(in_RSI + 6) = auVar64;
  return;
}

Assistant:

static inline void fdct8x8_new_sse2(const __m128i *input, __m128i *output,
                                    int8_t cos_bit) {
  const int32_t *cospi = cospi_arr(cos_bit);
  const __m128i __rounding = _mm_set1_epi32(1 << (cos_bit - 1));

  const __m128i cospi_m32_p32 = pair_set_epi16(-cospi[32], cospi[32]);
  const __m128i cospi_p32_p32 = pair_set_epi16(cospi[32], cospi[32]);
  const __m128i cospi_p32_m32 = pair_set_epi16(cospi[32], -cospi[32]);
  const __m128i cospi_p48_p16 = pair_set_epi16(cospi[48], cospi[16]);
  const __m128i cospi_m16_p48 = pair_set_epi16(-cospi[16], cospi[48]);
  const __m128i cospi_p56_p08 = pair_set_epi16(cospi[56], cospi[8]);
  const __m128i cospi_m08_p56 = pair_set_epi16(-cospi[8], cospi[56]);
  const __m128i cospi_p24_p40 = pair_set_epi16(cospi[24], cospi[40]);
  const __m128i cospi_m40_p24 = pair_set_epi16(-cospi[40], cospi[24]);

  // stage 1
  __m128i x1[8];
  x1[0] = _mm_adds_epi16(input[0], input[7]);
  x1[7] = _mm_subs_epi16(input[0], input[7]);
  x1[1] = _mm_adds_epi16(input[1], input[6]);
  x1[6] = _mm_subs_epi16(input[1], input[6]);
  x1[2] = _mm_adds_epi16(input[2], input[5]);
  x1[5] = _mm_subs_epi16(input[2], input[5]);
  x1[3] = _mm_adds_epi16(input[3], input[4]);
  x1[4] = _mm_subs_epi16(input[3], input[4]);

  // stage 2
  __m128i x2[8];
  x2[0] = _mm_adds_epi16(x1[0], x1[3]);
  x2[3] = _mm_subs_epi16(x1[0], x1[3]);
  x2[1] = _mm_adds_epi16(x1[1], x1[2]);
  x2[2] = _mm_subs_epi16(x1[1], x1[2]);
  x2[4] = x1[4];
  btf_16_sse2(cospi_m32_p32, cospi_p32_p32, x1[5], x1[6], x2[5], x2[6]);
  x2[7] = x1[7];

  // stage 3
  __m128i x3[8];
  btf_16_sse2(cospi_p32_p32, cospi_p32_m32, x2[0], x2[1], x3[0], x3[1]);
  btf_16_sse2(cospi_p48_p16, cospi_m16_p48, x2[2], x2[3], x3[2], x3[3]);
  x3[4] = _mm_adds_epi16(x2[4], x2[5]);
  x3[5] = _mm_subs_epi16(x2[4], x2[5]);
  x3[6] = _mm_subs_epi16(x2[7], x2[6]);
  x3[7] = _mm_adds_epi16(x2[7], x2[6]);

  // stage 4 and 5
  output[0] = x3[0];
  output[4] = x3[1];
  output[2] = x3[2];
  output[6] = x3[3];
  btf_16_sse2(cospi_p56_p08, cospi_m08_p56, x3[4], x3[7], output[1], output[7]);
  btf_16_sse2(cospi_p24_p40, cospi_m40_p24, x3[5], x3[6], output[5], output[3]);
}